

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_ignore_zeros.c
# Opt level: O2

void test_option_ignore_zeros_mode_t(void)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = make_files();
  if (iVar1 != 0) {
    return;
  }
  wVar2 = systemf("%s cf ab-norm.tar -C in a b > norm-c.out 2> norm-c.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
                      ,L'\'',0,"0",(long)wVar2,
                      "systemf( \"%s cf ab-norm.tar -C in a b > norm-c.out 2> norm-c.err\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'(',"norm-c.err");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L')',"norm-c.out");
  wVar2 = systemf("%s tf ab-norm.tar > norm-t.out 2> norm-t.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
                      ,L',',0,"0",(long)wVar2,
                      "systemf( \"%s tf ab-norm.tar > norm-t.out 2> norm-t.err\", testprog)",
                      (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'-',"norm-t.err");
  wVar2 = systemf("%s tf ab-cat.tar --ignore-zeros > test.out 2> test.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
                      ,L'2',0,"0",(long)wVar2,
                      "systemf( \"%s tf ab-cat.tar --ignore-zeros > test.out 2> test.err\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'3',"test.err");
  assertion_equal_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
             ,L'5',"test.out","norm-t.out");
  return;
}

Assistant:

DEFINE_TEST(test_option_ignore_zeros_mode_t)
{
	if (make_files())
		return;

	/* Generate expected t-mode output. */
	assertEqualInt(0, systemf(
	    "%s cf ab-norm.tar -C in a b > norm-c.out 2> norm-c.err",
	    testprog));
	assertEmptyFile("norm-c.err");
	assertEmptyFile("norm-c.out");
	assertEqualInt(0, systemf(
	    "%s tf ab-norm.tar > norm-t.out 2> norm-t.err",
	    testprog));
	assertEmptyFile("norm-t.err");

	/* Test output. */
	assertEqualInt(0, systemf(
	    "%s tf ab-cat.tar --ignore-zeros > test.out 2> test.err",
	    testprog));
	assertEmptyFile("test.err");

	assertEqualFile("test.out", "norm-t.out");
}